

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

int __thiscall
GGSock::Communicator::connect(Communicator *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  TSocketDescriptor *sock;
  uint __errnum;
  _Head_base<0UL,_GGSock::Communicator::Data_*,_false> this_00;
  uchar *puVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  in_addr_t iVar4;
  socklen_t sVar5;
  undefined8 in_RAX;
  hostent *phVar6;
  undefined7 extraout_var;
  uint *puVar7;
  char *pcVar8;
  undefined4 in_register_00000034;
  undefined4 uStack_38;
  int enable;
  
  this_00._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<GGSock::Communicator::Data,_std::default_delete<GGSock::Communicator::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::Communicator::Data_*,_std::default_delete<GGSock::Communicator::Data>_>
       .super__Head_base<0UL,_GGSock::Communicator::Data_*,_false>._M_head_impl;
  _uStack_38 = in_RAX;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)&(this_00._M_head_impl)->mutex)->__data);
  if (((this_00._M_head_impl)->isConnected == false) &&
     ((this_00._M_head_impl)->isConnecting == false)) {
    iVar3 = socket(2,1,6);
    sock = &(this_00._M_head_impl)->sd;
    (this_00._M_head_impl)->sd = iVar3;
    if (iVar3 < 0) {
      anon_unknown.dwarf_7a85::closeAndReset(sock);
      __stream = _stderr;
      puVar7 = (uint *)__errno_location();
      __errnum = *puVar7;
      pcVar8 = strerror(__errnum);
      iVar3 = 0;
      fprintf(__stream,"Error creating socket (%d %s)\n",(ulong)__errnum,pcVar8);
      goto LAB_0010ea11;
    }
    _uStack_38 = CONCAT44(1,uStack_38);
    iVar3 = setsockopt(iVar3,1,2,&enable,4);
    if (iVar3 < 0) {
      fwrite("setsockopt(SO_REUSEADDR) failed",0x1f,1,_stderr);
    }
    iVar3 = setsockopt(*sock,1,0xf,&enable,4);
    if (iVar3 < 0) {
      fwrite("setsockopt(SO_REUSEPORT) failed",0x1f,1,_stderr);
    }
    anon_unknown.dwarf_7a85::setNonBlocking(sock);
    phVar6 = gethostbyname(*(char **)CONCAT44(in_register_00000034,__fd));
    if (phVar6 != (hostent *)0x0) {
      ((this_00._M_head_impl)->addr).sin_family = 0;
      ((this_00._M_head_impl)->addr).sin_port = 0;
      ((this_00._M_head_impl)->addr).sin_addr = 0;
      puVar1 = (uchar *)((long)&(this_00._M_head_impl)->addr + 8);
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      ((this_00._M_head_impl)->addr).sin_family = 2;
      *(ushort *)((long)&(this_00._M_head_impl)->addr + 2) =
           (ushort)__addr << 8 | (ushort)__addr >> 8;
      iVar4 = inet_addr(*(char **)CONCAT44(in_register_00000034,__fd));
      ((in_addr *)((long)&(this_00._M_head_impl)->addr + 4))->s_addr = iVar4;
      (this_00._M_head_impl)->isServer = false;
      (this_00._M_head_impl)->isConnecting = true;
      sVar5 = 0;
      if (0 < (int)__len) {
        sVar5 = __len;
      }
      (this_00._M_head_impl)->timeoutConnect_ms = sVar5;
      if ((int)__len < 1) {
        iVar3 = (int)CONCAT71((uint7)(uint3)(__len >> 8),1);
        if (-1 < (int)__len) goto LAB_0010ea11;
        (this_00._M_head_impl)->timeoutConnect_ms = 1;
        do {
          if ((this_00._M_head_impl)->isConnecting != true) goto LAB_0010ea0f;
          bVar2 = Data::doConnect(this_00._M_head_impl);
        } while (!bVar2);
      }
      else {
        bVar2 = Data::doConnect(this_00._M_head_impl);
        iVar3 = (int)CONCAT71(extraout_var,bVar2);
      }
      (this_00._M_head_impl)->isConnecting = false;
      goto LAB_0010ea11;
    }
    fwrite("ERROR, no such host\n",0x14,1,_stderr);
  }
LAB_0010ea0f:
  iVar3 = 0;
LAB_0010ea11:
  pthread_mutex_unlock((pthread_mutex_t *)&(this_00._M_head_impl)->mutex);
  return iVar3;
}

Assistant:

bool Communicator::connect(const TAddress & address, TPort port, int32_t timeout_ms) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        if (data.isConnected) return false;
        if (data.isConnecting) return false;

        struct hostent *server;

        data.sd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
        if (data.sd < 0) {
            ::closeAndReset(data.sd);
            fprintf(stderr, "Error creating socket (%d %s)\n", errno, strerror(errno));
            return false;
        }

        int enable = 1;
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEADDR, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEADDR) failed");
        }

#ifndef _WIN32
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEPORT, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEPORT) failed");
        }
#endif

        //{
        //    linger lin;
        //    lin.l_onoff = 0;
        //    lin.l_linger = 0;
        //    if (setsockopt(data.sd, SOL_SOCKET, SO_LINGER, (const char *)&lin, sizeof(lin)) < 0) {
        //        fprintf(stderr, "setsockopt(SO_LINGER) failed");
        //    }
        //}

        ::setNonBlocking(data.sd);

        server = gethostbyname(address.c_str());
        if (server == NULL) {
            fprintf(stderr,"ERROR, no such host\n");
            return false;
        }

        auto & addr = data.addr;
        memset((char *) &addr, '\0', sizeof(addr));

        addr.sin_family = AF_INET;
        addr.sin_port = htons(port);
        addr.sin_addr.s_addr = inet_addr(address.c_str());

        data.isServer = false;
        data.isConnecting = true;

        data.timeoutConnect_ms = (std::max)(0, timeout_ms);
        if (timeout_ms > 0) {
            bool res = data.doConnect();

            data.isConnecting = false;
            return res;
        } else if (timeout_ms < 0) {
            data.timeoutConnect_ms = 1;
            while (data.isConnecting) {
                bool success = data.doConnect();
                if (success) {
                    data.isConnecting = false;
                    return true;
                }
            }
            return false;
        }

        return true;
    }